

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::addViolation
          (ValidStatusCodes *this,
          vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
          *dst,GLenum code,char *description)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  allocator<char> local_d1;
  value_type local_d0;
  undefined1 local_b0 [8];
  RuleViolation violation;
  allocator<char> local_51;
  value_type local_50;
  int local_2c;
  char *pcStack_28;
  int ndx;
  char *description_local;
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  *pvStack_18;
  GLenum code_local;
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  *dst_local;
  ValidStatusCodes *this_local;
  
  local_2c = 0;
  pcStack_28 = description;
  description_local._4_4_ = code;
  pvStack_18 = dst;
  dst_local = &this->m_errorCodes;
  while( true ) {
    iVar1 = local_2c;
    sVar3 = std::
            vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
            ::size(pvStack_18);
    if ((int)sVar3 <= iVar1) {
      RuleViolation::RuleViolation((RuleViolation *)local_b0);
      pcVar2 = pcStack_28;
      local_b0._0_4_ = description_local._4_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar2,&local_d1);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&violation,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      std::
      vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
      ::push_back(pvStack_18,(value_type *)local_b0);
      RuleViolation::~RuleViolation((RuleViolation *)local_b0);
      return;
    }
    pvVar4 = std::
             vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ::operator[](pvStack_18,(long)local_2c);
    if (pvVar4->errorCode == description_local._4_4_) break;
    local_2c = local_2c + 1;
  }
  pvVar4 = std::
           vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ::operator[](pvStack_18,(long)local_2c);
  pcVar2 = pcStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_51);
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&pvVar4->rules,&local_50);
  violation.rules._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar5.first._M_node;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void ValidStatusCodes::addViolation (std::vector<RuleViolation>& dst, glw::GLenum code, const char* description) const
{
	// rule violation already exists?
	for (int ndx = 0; ndx < (int)dst.size(); ++ndx)
	{
		if (dst[ndx].errorCode == code)
		{
			dst[ndx].rules.insert(std::string(description));
			return;
		}
	}

	// new violation
	{
		RuleViolation violation;

		violation.errorCode = code;
		violation.rules.insert(std::string(description));

		dst.push_back(violation);
	}
}